

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

access_to_missing_argument * __thiscall
boost::runtime::
specific_param_error<boost::runtime::access_to_missing_argument,_boost::runtime::init_error>::
operator<<(access_to_missing_argument *__return_storage_ptr__,
          specific_param_error<boost::runtime::access_to_missing_argument,_boost::runtime::init_error>
          *this,char *val)

{
  std::__cxx11::string::append((char *)&(this->super_init_error).super_param_error.msg);
  access_to_missing_argument::access_to_missing_argument
            (__return_storage_ptr__,(access_to_missing_argument *)this);
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }